

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall
BackwardPass::NeedBailOutOnImplicitCallsForTypedArrayStore(BackwardPass *this,Instr *instr)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  undefined8 in_RAX;
  IndirOpnd *pIVar3;
  RegOpnd *pRVar4;
  undefined4 *puVar5;
  undefined8 uStack_18;
  
  if (((instr->m_opcode == StElemI_A_Strict) || (instr->m_opcode == StElemI_A)) &&
     (uStack_18 = in_RAX, bVar2 = IR::Opnd::IsIndirOpnd(instr->m_dst), bVar2)) {
    pIVar3 = IR::Opnd::AsIndirOpnd(instr->m_dst);
    uStack_18._0_6_ =
         CONCAT24((pIVar3->m_baseOpnd->super_Opnd).m_valueType.field_0.bits,(undefined4)uStack_18);
    bVar2 = ValueType::IsLikelyTypedArray((ValueType *)((long)&uStack_18 + 4));
    if (bVar2) {
      this_00 = instr->m_src1;
      bVar2 = IR::Opnd::IsRegOpnd(this_00);
      if (bVar2) {
        pRVar4 = IR::Opnd::AsRegOpnd(this_00);
        uStack_18 = CONCAT26((pRVar4->super_Opnd).m_valueType.field_0.bits,(undefined6)uStack_18);
        bVar2 = ValueType::IsPrimitive((ValueType *)((long)&uStack_18 + 6));
        if (((!bVar2) && (pRVar4 = IR::Opnd::AsRegOpnd(this_00), pRVar4->m_sym->m_type != TyInt32))
           && (pRVar4 = IR::Opnd::AsRegOpnd(this_00), pRVar4->m_sym->m_type != TyFloat64)) {
          pRVar4 = IR::Opnd::AsRegOpnd(this_00);
          bVar2 = StackSym::IsFloatConst(pRVar4->m_sym);
          if (!bVar2) {
            pRVar4 = IR::Opnd::AsRegOpnd(this_00);
            bVar2 = StackSym::IsIntConst(pRVar4->m_sym);
            return !bVar2;
          }
        }
      }
      else {
        bVar2 = IR::Opnd::IsIntConstOpnd(this_00);
        if (((!bVar2) && (bVar2 = IR::Opnd::IsInt64ConstOpnd(this_00), !bVar2)) &&
           ((bVar2 = IR::Opnd::IsFloat32ConstOpnd(this_00), !bVar2 &&
            ((bVar2 = IR::Opnd::IsFloatConstOpnd(this_00), !bVar2 &&
             (bVar2 = IR::Opnd::IsAddrOpnd(this_00), !bVar2)))))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0xa0f,
                             "(opnd->IsIntConstOpnd() || opnd->IsInt64ConstOpnd() || opnd->IsFloat32ConstOpnd() || opnd->IsFloatConstOpnd() || opnd->IsAddrOpnd())"
                             ,
                             "opnd->IsIntConstOpnd() || opnd->IsInt64ConstOpnd() || opnd->IsFloat32ConstOpnd() || opnd->IsFloatConstOpnd() || opnd->IsAddrOpnd()"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
      }
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::NeedBailOutOnImplicitCallsForTypedArrayStore(IR::Instr* instr)
{
    if ((instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict) &&
        instr->GetDst()->IsIndirOpnd() &&
        instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyTypedArray())
    {
        IR::Opnd * opnd = instr->GetSrc1();
        if (opnd->IsRegOpnd())
        {
            return !opnd->AsRegOpnd()->GetValueType().IsPrimitive() &&
                !opnd->AsRegOpnd()->m_sym->IsInt32() &&
                !opnd->AsRegOpnd()->m_sym->IsFloat64() &&
                !opnd->AsRegOpnd()->m_sym->IsFloatConst() &&
                !opnd->AsRegOpnd()->m_sym->IsIntConst();
        }
        else
        {
            Assert(opnd->IsIntConstOpnd() || opnd->IsInt64ConstOpnd() || opnd->IsFloat32ConstOpnd() || opnd->IsFloatConstOpnd() || opnd->IsAddrOpnd());
        }
    }
    return false;
}